

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logmath.c
# Opt level: O2

int logmath_add(logmath_t *lmath,int logb_x,int logb_y)

{
  uint8 uVar1;
  void *pvVar2;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  logadd_t *t;
  uint uVar6;
  double dVar7;
  double dVar8;
  
  iVar5 = logb_y;
  if ((lmath->zero < logb_x) && (iVar5 = logb_x, lmath->zero < logb_y)) {
    pvVar2 = (lmath->t).table;
    if (pvVar2 == (void *)0x0) {
      dVar7 = pow((double)lmath->base,(double)(logb_x << ((lmath->t).shift & 0x1fU)));
      dVar8 = pow((double)lmath->base,(double)(logb_y << ((lmath->t).shift & 0x1fU)));
      iVar5 = logmath_log(lmath,(float64)(dVar8 + dVar7));
      return iVar5;
    }
    uVar6 = logb_x - logb_y;
    if (uVar6 != 0 && logb_y <= logb_x) {
      logb_y = logb_x;
    }
    uVar3 = -uVar6;
    if (0 < (int)uVar6) {
      uVar3 = uVar6;
    }
    uVar4 = (ulong)uVar3;
    iVar5 = logb_y;
    if (uVar3 < (lmath->t).table_size) {
      uVar1 = (lmath->t).width;
      if (uVar1 == '\x04') {
        iVar5 = logb_y + *(int *)((long)pvVar2 + uVar4 * 4);
      }
      else {
        if (uVar1 == '\x02') {
          uVar6 = (uint)*(ushort *)((long)pvVar2 + uVar4 * 2);
        }
        else {
          if (uVar1 != '\x01') {
            return logb_y;
          }
          uVar6 = (uint)*(byte *)((long)pvVar2 + uVar4);
        }
        iVar5 = logb_y + uVar6;
      }
    }
  }
  return iVar5;
}

Assistant:

int
logmath_add(logmath_t *lmath, int logb_x, int logb_y)
{
    logadd_t *t = LOGMATH_TABLE(lmath);
    int d, r;

    /* handle 0 + x = x case. */
    if (logb_x <= lmath->zero)
        return logb_y;
    if (logb_y <= lmath->zero)
        return logb_x;

    if (t->table == NULL)
        return logmath_add_exact(lmath, logb_x, logb_y);

    /* d must be positive, obviously. */
    if (logb_x > logb_y) {
        d = (logb_x - logb_y);
        r = logb_x;
    }
    else {
        d = (logb_y - logb_x);
        r = logb_y;
    }

    if (d < 0) {
        /* Some kind of overflow has occurred, fail gracefully. */
        return r;
    }
    if ((size_t)d >= t->table_size) {
        /* If this happens, it's not actually an error, because the
         * last entry in the logadd table is guaranteed to be zero.
         * Therefore we just return the larger of the two values. */
        return r;
    }

    switch (t->width) {
    case 1:
        return r + (((uint8 *)t->table)[d]);
    case 2:
        return r + (((uint16 *)t->table)[d]);
    case 4:
        return r + (((uint32 *)t->table)[d]);
    }
    return r;
}